

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

string * HelpMessageOpt(string *__return_storage_ptr__,string *option,string *message)

{
  long in_FS_OFFSET;
  string_view in;
  allocator<char> local_15a;
  allocator<char> local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8.field_2._M_allocated_capacity._0_2_ = 0x2020;
  local_b8._M_string_length = 2;
  local_b8.field_2._M_local_buf[2] = '\0';
  std::__cxx11::string::string((string *)&local_d8,option);
  std::operator+(&local_98,&local_b8,&local_d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"\n",&local_159);
  std::operator+(&local_78,&local_98,&local_f8);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118.field_2._M_allocated_capacity._0_4_ = 0x20202020;
  local_118.field_2._M_allocated_capacity._4_3_ = 0x202020;
  local_118._M_string_length = 7;
  local_118.field_2._M_local_buf[7] = '\0';
  std::operator+(&local_58,&local_78,&local_118);
  in._M_str = (message->_M_dataplus)._M_p;
  in._M_len = message->_M_string_length;
  FormatParagraph_abi_cxx11_(&local_138,in,0x48,7);
  std::operator+(&local_38,&local_58,&local_138);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"\n\n",&local_15a);
  std::operator+(__return_storage_ptr__,&local_38,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string HelpMessageOpt(const std::string &option, const std::string &message) {
    return std::string(optIndent,' ') + std::string(option) +
           std::string("\n") + std::string(msgIndent,' ') +
           FormatParagraph(message, screenWidth - msgIndent, msgIndent) +
           std::string("\n\n");
}